

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O3

void __thiscall
jsonChildren::insert(jsonChildren *this,JSONNode ***position,JSONNode **items,json_index_t num)

{
  JSONNode **ppJVar1;
  JSONNode **ppJVar2;
  
  ppJVar2 = *position;
  ppJVar1 = this->array;
  inc(this,num);
  ppJVar2 = (JSONNode **)(((long)ppJVar2 - (long)ppJVar1 & 0x7fffffff8U) + (long)this->array);
  *position = ppJVar2;
  memmove(ppJVar2 + num,ppJVar2,(long)this->array + ((ulong)this->mysize * 8 - (long)ppJVar2));
  memcpy(*position,items,(ulong)num << 3);
  this->mysize = this->mysize + num;
  return;
}

Assistant:

void insert(JSONNode ** & position, JSONNode ** items, json_index_t num) json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null insert 2"));
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array insert 2"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("position is above the end of the array insert 2"));
	   {
		  iteratorKeeper<false> ik(this, position);
		  inc(num);
	   }
	   const size_t ptrs = ((JSONNode **)(array + mysize)) - position;
	   std::memmove(position + num, position, ptrs * sizeof(JSONNode *));
	   std::memcpy(position, items, num * sizeof(JSONNode *));
	   mysize += num;
    }